

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

bool __thiscall BCLog::Logger::Enabled(Logger *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    bVar3 = true;
    if (((this->m_buffering == false) && (this->m_print_to_console == false)) &&
       (this->m_print_to_file == false)) {
      bVar3 = (this->m_print_callbacks).
              super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
              ._M_impl._M_node.super__List_node_base._M_next !=
              (_List_node_base *)&this->m_print_callbacks;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return bVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_cs)
        {
            StdLockGuard scoped_lock(m_cs);
            return m_buffering || m_print_to_console || m_print_to_file || !m_print_callbacks.empty();
        }